

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string __thiscall crnlib::operator+(crnlib *this,dynamic_string *a,dynamic_string *b)

{
  dynamic_string *other;
  char *extraout_RDX;
  dynamic_string dVar1;
  dynamic_string local_30;
  dynamic_string *local_20;
  dynamic_string *b_local;
  dynamic_string *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = (dynamic_string *)this;
  dynamic_string::dynamic_string(&local_30,a);
  other = dynamic_string::append(&local_30,local_20);
  dynamic_string::dynamic_string((dynamic_string *)this,other);
  dynamic_string::~dynamic_string(&local_30);
  dVar1.m_pStr = extraout_RDX;
  dVar1._0_8_ = this;
  return dVar1;
}

Assistant:

dynamic_string operator+(const dynamic_string& a, const dynamic_string& b)
    {
        return dynamic_string(a).append(b);
    }